

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDirectoryIterator.cpp
# Opt level: O3

FilePath * __thiscall
de::DirectoryIterator::getItem(FilePath *__return_storage_ptr__,DirectoryIterator *this)

{
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,this->m_curEntry->d_name,&local_39);
  FilePath::join(__return_storage_ptr__,&this->m_path,(FilePath *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath DirectoryIterator::getItem (void) const
{
	DE_ASSERT(hasItem());
	return FilePath::join(m_path, m_curEntry->d_name);
}